

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

RGBSpectrum * pbrt::HairBxDF::SigmaAFromConcentration(Float ce,Float cp)

{
  undefined8 uVar1;
  RGBSpectrum *in_RDI;
  undefined1 auVar5 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  Float FVar6;
  RGB RVar7;
  RGB sigma_a;
  RGB pheomelaninSigmaA;
  RGB eumelaninSigmaA;
  RGB *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  Float in_stack_ffffffffffffff94;
  RGBSpectrum *in_stack_ffffffffffffffe0;
  RGB local_14;
  
  RGB::RGB(&local_14,0.419,0.697,1.37);
  RGB::RGB((RGB *)&stack0xffffffffffffffe0,0.187,0.4,1.05);
  auVar5 = (undefined1  [56])0x0;
  RVar7 = pbrt::operator*(in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
  FVar6 = RVar7.b;
  auVar2._0_8_ = RVar7._0_8_;
  auVar2._8_56_ = auVar5;
  vmovlpd_avx(auVar2._0_16_);
  auVar5 = (undefined1  [56])0x0;
  RVar7 = pbrt::operator*(in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
  auVar3._0_8_ = RVar7._0_8_;
  auVar3._8_56_ = auVar5;
  vmovlpd_avx(auVar3._0_16_);
  RVar7 = RGB::operator+((RGB *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff88);
  auVar4._0_8_ = RVar7._0_8_;
  auVar4._8_56_ = auVar5;
  uVar1 = vmovlpd_avx(auVar4._0_16_);
  RGBSpectrum::RGBSpectrum
            (in_stack_ffffffffffffffe0,
             (RGBColorSpace *)CONCAT44(RVar7.b,(int)((ulong)uVar1 >> 0x20)),
             (RGB *)CONCAT44((int)uVar1,FVar6));
  return in_RDI;
}

Assistant:

RGBSpectrum HairBxDF::SigmaAFromConcentration(Float ce, Float cp) {
    RGB eumelaninSigmaA(0.419f, 0.697f, 1.37f);
    RGB pheomelaninSigmaA(0.187f, 0.4f, 1.05f);
    RGB sigma_a = ce * eumelaninSigmaA + cp * pheomelaninSigmaA;
#ifdef PBRT_IS_GPU_CODE
    return RGBSpectrum(*RGBColorSpace_sRGB, sigma_a);
#else
    return RGBSpectrum(*RGBColorSpace::sRGB, sigma_a);
#endif
}